

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::mouseMoveEvent(QTextEdit *this,QMouseEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  long lVar2;
  char cVar3;
  undefined4 uVar4;
  uint uVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar11 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  QPoint pos;
  undefined1 *local_50;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  *(byte *)(lVar1 + 800) = *(byte *)(lVar1 + 800) & 0xf7;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  uVar4 = QEventPoint::position();
  auVar12._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar12._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar12 = minpd(_DAT_0066f5d0,auVar12);
  auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
  auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
  uVar5 = movmskpd(uVar4,auVar11);
  uVar10 = 0x8000000000000000;
  if ((uVar5 & 1) != 0) {
    uVar10 = (ulong)(uint)(int)auVar12._0_8_ << 0x20;
  }
  uVar9 = 0x80000000;
  if ((uVar5 & 2) != 0) {
    uVar9 = (ulong)(uint)(int)auVar12._8_8_;
  }
  local_50 = (undefined1 *)(uVar9 | uVar10);
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar6 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar6 == RightToLeft) {
    iVar7 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar8 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar7 = iVar7 - iVar8;
  }
  else {
    iVar7 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar8 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_48.yp = (qreal)iVar8;
  local_48.xp = (double)iVar7;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_48,*(QWidget **)(lVar1 + 0x2b0));
  if (((byte)e[0x44] & 1) != 0) {
    iVar7 = QMouseEvent::source();
    if (iVar7 == 0) {
      lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
      local_48.yp = (qreal)CONCAT44(*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18),
                                    *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14));
      local_48.xp = 0.0;
      cVar3 = QRect::contains((QPoint *)&local_48,SUB81(&local_50,0));
      if (cVar3 == '\0') {
        if (*(int *)(lVar1 + 0x308) == 0) {
          QBasicTimer::start((int *)(lVar1 + 0x308),100000000,1,this);
        }
      }
      else {
        QBasicTimer::stop();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}